

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O2

BrandedDecl * __thiscall
capnp::compiler::BrandScope::decompileType
          (BrandedDecl *__return_storage_ptr__,BrandScope *this,Resolver *resolver,Reader type)

{
  short sVar1;
  undefined2 *puVar2;
  Reader type_00;
  Reader subSource;
  undefined1 auVar3 [40];
  Reader brand;
  Reader source;
  Reader brand_00;
  Reader source_00;
  Reader brand_01;
  Reader source_01;
  Which which;
  undefined8 uVar4;
  uint index;
  uint64_t scopeId;
  anon_class_16_2_36210f71 builtin;
  ResolvedDecl decl;
  Array<capnp::compiler::BrandedDecl> local_6c0;
  Reader structType;
  undefined1 local_538 [40];
  undefined1 local_510;
  SegmentReader *local_508;
  CapTableReader *pCStack_500;
  void *local_4f8;
  WirePointer *pWStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined1 local_4d8 [40];
  undefined1 local_4b0;
  SegmentReader *local_4a8;
  CapTableReader *pCStack_4a0;
  void *local_498;
  WirePointer *pWStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined1 local_478 [40];
  undefined1 local_450;
  SegmentReader *local_448;
  CapTableReader *pCStack_440;
  void *local_438;
  WirePointer *pWStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  BrandedDecl elementType;
  ResolvedDecl local_368;
  ResolvedDecl local_308;
  ResolvedDecl local_2a8;
  Reader local_248;
  Reader local_218;
  Reader local_1e8;
  NullableValue<capnp::compiler::BrandedDecl> local_1b8;
  BrandedDecl local_108;
  Reader local_60;
  
  builtin.resolver = resolver;
  builtin.this = this;
  if (type._reader.dataSize < 0x10) {
switchD_00121dbe_caseD_0:
    which = BUILTIN_VOID;
  }
  else {
    puVar2 = (undefined2 *)type._reader.data;
    switch(*puVar2) {
    case 0:
      goto switchD_00121dbe_caseD_0;
    case 1:
      which = BUILTIN_BOOL;
      break;
    case 2:
      which = BUILTIN_INT8;
      break;
    case 3:
      which = BUILTIN_INT16;
      break;
    case 4:
      which = BUILTIN_INT32;
      break;
    case 5:
      which = BUILTIN_INT64;
      break;
    case 6:
      which = BUILTIN_U_INT8;
      break;
    case 7:
      which = BUILTIN_U_INT16;
      break;
    case 8:
      which = BUILTIN_U_INT32;
      break;
    case 9:
      which = BUILTIN_U_INT64;
      break;
    case 10:
      which = BUILTIN_FLOAT32;
      break;
    case 0xb:
      which = BUILTIN_FLOAT64;
      break;
    case 0xc:
      which = BUILTIN_TEXT;
      break;
    case 0xd:
      which = BUILTIN_DATA;
      break;
    case 0xe:
      decl.id = (uint64_t)type._reader.segment;
      decl._8_8_ = type._reader.capTable;
      decl._24_8_ = type._reader.pointers;
      decl.resolver = type._reader._32_8_;
      decl.brand.ptr._0_8_ = type._reader._40_8_;
      decl.scopeId = (uint64_t)puVar2;
      capnp::schema::Type::List::Reader::getElementType(&local_60,(Reader *)&decl);
      type_00._reader.capTable = local_60._reader.capTable;
      type_00._reader.segment = local_60._reader.segment;
      type_00._reader.data = local_60._reader.data;
      type_00._reader.pointers = local_60._reader.pointers;
      type_00._reader.dataSize = local_60._reader.dataSize;
      type_00._reader.pointerCount = local_60._reader.pointerCount;
      type_00._reader._38_2_ = local_60._reader._38_2_;
      type_00._reader.nestingLimit = local_60._reader.nestingLimit;
      type_00._reader._44_4_ = local_60._reader._44_4_;
      decompileType(&elementType,this,resolver,type_00);
      decompileType::anon_class_16_2_36210f71::operator()(&local_108,&builtin,BUILTIN_LIST);
      kj::heapArray<capnp::compiler::BrandedDecl>(&local_6c0,&elementType,1);
      auVar3 = ZEXT1640(ZEXT816(0));
      subSource._reader._40_8_ = 0x7fffffff;
      subSource._reader.segment = (SegmentReader *)auVar3._0_8_;
      subSource._reader.capTable = (CapTableReader *)auVar3._8_8_;
      subSource._reader.data = (void *)auVar3._16_8_;
      subSource._reader.pointers = (WirePointer *)auVar3._24_8_;
      subSource._reader.dataSize = auVar3._32_4_;
      subSource._reader.pointerCount = auVar3._36_2_;
      subSource._reader._38_2_ = auVar3._38_2_;
      BrandedDecl::applyParams
                ((Maybe<capnp::compiler::BrandedDecl> *)&local_1b8,&local_108,&local_6c0,subSource);
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                ((NullableValue<capnp::compiler::BrandedDecl> *)&structType,&local_1b8);
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue(&local_1b8);
      kj::Array<capnp::compiler::BrandedDecl>::~Array(&local_6c0);
      BrandedDecl::~BrandedDecl(&local_108);
      if ((char)structType._reader.segment != '\0') {
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                  ((NullableValue<capnp::compiler::BrandedDecl> *)&decl,
                   (NullableValue<capnp::compiler::BrandedDecl> *)&structType);
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
                  ((NullableValue<capnp::compiler::BrandedDecl> *)&structType);
        BrandedDecl::BrandedDecl(__return_storage_ptr__,(BrandedDecl *)&decl.genericParamCount);
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
                  ((NullableValue<capnp::compiler::BrandedDecl> *)&decl);
        BrandedDecl::~BrandedDecl(&elementType);
        return __return_storage_ptr__;
      }
      kj::_::Debug::Fault::Fault
                ((Fault *)&local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.c++"
                 ,499,FAILED,
                 "builtin(Declaration::BUILTIN_LIST) .applyParams(kj::heapArray(&elementType, 1), Expression::Reader()) != nullptr"
                 ,"");
      kj::_::Debug::Fault::fatal((Fault *)&local_1b8);
    case 0xf:
      structType._reader.dataSize = type._reader.dataSize;
      structType._reader.pointerCount = type._reader.pointerCount;
      structType._reader._38_2_ = type._reader._38_2_;
      structType._reader.nestingLimit = type._reader.nestingLimit;
      structType._reader._44_4_ = type._reader._44_4_;
      structType._reader.data._0_4_ = type._reader.data._0_4_;
      structType._reader.data._4_4_ = type._reader.data._4_4_;
      structType._reader.pointers._0_4_ = type._reader.pointers._0_4_;
      structType._reader.pointers._4_4_ = type._reader.pointers._4_4_;
      structType._reader.segment._0_4_ = type._reader.segment._0_4_;
      structType._reader.segment._4_4_ = type._reader.segment._4_4_;
      structType._reader.capTable._0_4_ = type._reader.capTable._0_4_;
      structType._reader.capTable._4_4_ = type._reader.capTable._4_4_;
      if (type._reader.dataSize < 0x80) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(undefined8 *)(puVar2 + 4);
      }
      (*resolver->_vptr_Resolver[3])(&decl,resolver,uVar4);
      local_2a8.resolver = decl.resolver;
      local_2a8.scopeId = decl.scopeId;
      local_2a8.kind = decl.kind;
      local_2a8._26_6_ = decl._26_6_;
      local_2a8.id = decl.id;
      local_2a8.genericParamCount = decl.genericParamCount;
      local_2a8._12_4_ = decl._12_4_;
      local_2a8.brand.ptr.isSet = decl.brand.ptr.isSet;
      if (decl.brand.ptr.isSet != false) {
        local_2a8.brand.ptr.field_1._32_8_ = decl.brand.ptr.field_1._32_8_;
        local_2a8.brand.ptr.field_1._40_8_ = decl.brand.ptr.field_1._40_8_;
        local_2a8.brand.ptr.field_1.value._reader.data = decl.brand.ptr.field_1.value._reader.data;
        local_2a8.brand.ptr.field_1.value._reader.pointers =
             decl.brand.ptr.field_1.value._reader.pointers;
        local_2a8.brand.ptr.field_1.value._reader.segment =
             decl.brand.ptr.field_1.value._reader.segment;
        local_2a8.brand.ptr.field_1.value._reader.capTable =
             decl.brand.ptr.field_1.value._reader.capTable;
        local_448 = decl.brand.ptr.field_1.value._reader.segment;
        pCStack_440 = decl.brand.ptr.field_1.value._reader.capTable;
        local_438 = decl.brand.ptr.field_1.value._reader.data;
        pWStack_430 = decl.brand.ptr.field_1.value._reader.pointers;
        local_428 = decl.brand.ptr.field_1._32_8_;
        uStack_420 = decl.brand.ptr.field_1._40_8_;
      }
      local_450 = decl.brand.ptr.isSet;
      capnp::schema::Type::Enum::Reader::getBrand((Reader *)&local_1b8,(Reader *)&structType);
      capnp::schema::Brand::Reader::getScopes(&local_1e8,(Reader *)&local_1b8);
      brand_00.reader.capTable = local_1e8.reader.capTable;
      brand_00.reader.segment = local_1e8.reader.segment;
      brand_00.reader.ptr = local_1e8.reader.ptr;
      brand_00.reader.elementCount = local_1e8.reader.elementCount;
      brand_00.reader.step = local_1e8.reader.step;
      brand_00.reader.structDataSize = local_1e8.reader.structDataSize;
      brand_00.reader.structPointerCount = local_1e8.reader.structPointerCount;
      brand_00.reader.elementSize = local_1e8.reader.elementSize;
      brand_00.reader._39_1_ = local_1e8.reader._39_1_;
      brand_00.reader.nestingLimit = local_1e8.reader.nestingLimit;
      brand_00.reader._44_4_ = local_1e8.reader._44_4_;
      evaluateBrand((BrandScope *)&elementType,(Resolver *)this,(ResolvedDecl *)resolver,brand_00,
                    (uint)local_478);
      auVar3 = ZEXT1640(ZEXT816(0));
      source_00._reader._40_8_ = 0x7fffffff;
      source_00._reader.segment = (SegmentReader *)auVar3._0_8_;
      source_00._reader.capTable = (CapTableReader *)auVar3._8_8_;
      source_00._reader.data = (void *)auVar3._16_8_;
      source_00._reader.pointers = (WirePointer *)auVar3._24_8_;
      source_00._reader.dataSize = auVar3._32_4_;
      source_00._reader.pointerCount = auVar3._36_2_;
      source_00._reader._38_2_ = auVar3._38_2_;
      BrandedDecl::BrandedDecl
                (__return_storage_ptr__,&local_2a8,
                 (Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&elementType,source_00);
      kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose
                ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&elementType);
      return __return_storage_ptr__;
    case 0x10:
      structType._reader.dataSize = type._reader.dataSize;
      structType._reader.pointerCount = type._reader.pointerCount;
      structType._reader._38_2_ = type._reader._38_2_;
      structType._reader.nestingLimit = type._reader.nestingLimit;
      structType._reader._44_4_ = type._reader._44_4_;
      structType._reader.data._0_4_ = type._reader.data._0_4_;
      structType._reader.data._4_4_ = type._reader.data._4_4_;
      structType._reader.pointers._0_4_ = type._reader.pointers._0_4_;
      structType._reader.pointers._4_4_ = type._reader.pointers._4_4_;
      structType._reader.segment._0_4_ = type._reader.segment._0_4_;
      structType._reader.segment._4_4_ = type._reader.segment._4_4_;
      structType._reader.capTable._0_4_ = type._reader.capTable._0_4_;
      structType._reader.capTable._4_4_ = type._reader.capTable._4_4_;
      if (type._reader.dataSize < 0x80) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(undefined8 *)(puVar2 + 4);
      }
      (*resolver->_vptr_Resolver[3])(&decl,resolver,uVar4);
      local_368.resolver = decl.resolver;
      local_368.scopeId = decl.scopeId;
      local_368.kind = decl.kind;
      local_368._26_6_ = decl._26_6_;
      local_368.id = decl.id;
      local_368.genericParamCount = decl.genericParamCount;
      local_368._12_4_ = decl._12_4_;
      local_368.brand.ptr.isSet = decl.brand.ptr.isSet;
      if (decl.brand.ptr.isSet != false) {
        local_368.brand.ptr.field_1._32_8_ = decl.brand.ptr.field_1._32_8_;
        local_368.brand.ptr.field_1._40_8_ = decl.brand.ptr.field_1._40_8_;
        local_368.brand.ptr.field_1.value._reader.data = decl.brand.ptr.field_1.value._reader.data;
        local_368.brand.ptr.field_1.value._reader.pointers =
             decl.brand.ptr.field_1.value._reader.pointers;
        local_368.brand.ptr.field_1.value._reader.segment =
             decl.brand.ptr.field_1.value._reader.segment;
        local_368.brand.ptr.field_1.value._reader.capTable =
             decl.brand.ptr.field_1.value._reader.capTable;
        local_508 = decl.brand.ptr.field_1.value._reader.segment;
        pCStack_500 = decl.brand.ptr.field_1.value._reader.capTable;
        local_4f8 = decl.brand.ptr.field_1.value._reader.data;
        pWStack_4f0 = decl.brand.ptr.field_1.value._reader.pointers;
        local_4e8 = decl.brand.ptr.field_1._32_8_;
        uStack_4e0 = decl.brand.ptr.field_1._40_8_;
      }
      local_510 = decl.brand.ptr.isSet;
      capnp::schema::Type::Struct::Reader::getBrand((Reader *)&local_1b8,&structType);
      capnp::schema::Brand::Reader::getScopes(&local_248,(Reader *)&local_1b8);
      brand.reader.capTable = local_248.reader.capTable;
      brand.reader.segment = local_248.reader.segment;
      brand.reader.ptr = local_248.reader.ptr;
      brand.reader.elementCount = local_248.reader.elementCount;
      brand.reader.step = local_248.reader.step;
      brand.reader.structDataSize = local_248.reader.structDataSize;
      brand.reader.structPointerCount = local_248.reader.structPointerCount;
      brand.reader.elementSize = local_248.reader.elementSize;
      brand.reader._39_1_ = local_248.reader._39_1_;
      brand.reader.nestingLimit = local_248.reader.nestingLimit;
      brand.reader._44_4_ = local_248.reader._44_4_;
      evaluateBrand((BrandScope *)&elementType,(Resolver *)this,(ResolvedDecl *)resolver,brand,
                    (uint)local_538);
      auVar3 = ZEXT1640(ZEXT816(0));
      source._reader._40_8_ = 0x7fffffff;
      source._reader.segment = (SegmentReader *)auVar3._0_8_;
      source._reader.capTable = (CapTableReader *)auVar3._8_8_;
      source._reader.data = (void *)auVar3._16_8_;
      source._reader.pointers = (WirePointer *)auVar3._24_8_;
      source._reader.dataSize = auVar3._32_4_;
      source._reader.pointerCount = auVar3._36_2_;
      source._reader._38_2_ = auVar3._38_2_;
      BrandedDecl::BrandedDecl
                (__return_storage_ptr__,&local_368,
                 (Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&elementType,source);
      kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose
                ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&elementType);
      return __return_storage_ptr__;
    case 0x11:
      structType._reader.dataSize = type._reader.dataSize;
      structType._reader.pointerCount = type._reader.pointerCount;
      structType._reader._38_2_ = type._reader._38_2_;
      structType._reader.nestingLimit = type._reader.nestingLimit;
      structType._reader._44_4_ = type._reader._44_4_;
      structType._reader.data._0_4_ = type._reader.data._0_4_;
      structType._reader.data._4_4_ = type._reader.data._4_4_;
      structType._reader.pointers._0_4_ = type._reader.pointers._0_4_;
      structType._reader.pointers._4_4_ = type._reader.pointers._4_4_;
      structType._reader.segment._0_4_ = type._reader.segment._0_4_;
      structType._reader.segment._4_4_ = type._reader.segment._4_4_;
      structType._reader.capTable._0_4_ = type._reader.capTable._0_4_;
      structType._reader.capTable._4_4_ = type._reader.capTable._4_4_;
      if (type._reader.dataSize < 0x80) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(undefined8 *)(puVar2 + 4);
      }
      (*resolver->_vptr_Resolver[3])(&decl,resolver,uVar4);
      local_308.resolver = decl.resolver;
      local_308.scopeId = decl.scopeId;
      local_308.kind = decl.kind;
      local_308._26_6_ = decl._26_6_;
      local_308.id = decl.id;
      local_308.genericParamCount = decl.genericParamCount;
      local_308._12_4_ = decl._12_4_;
      local_308.brand.ptr.isSet = decl.brand.ptr.isSet;
      if (decl.brand.ptr.isSet != false) {
        local_308.brand.ptr.field_1._32_8_ = decl.brand.ptr.field_1._32_8_;
        local_308.brand.ptr.field_1._40_8_ = decl.brand.ptr.field_1._40_8_;
        local_308.brand.ptr.field_1.value._reader.data = decl.brand.ptr.field_1.value._reader.data;
        local_308.brand.ptr.field_1.value._reader.pointers =
             decl.brand.ptr.field_1.value._reader.pointers;
        local_308.brand.ptr.field_1.value._reader.segment =
             decl.brand.ptr.field_1.value._reader.segment;
        local_308.brand.ptr.field_1.value._reader.capTable =
             decl.brand.ptr.field_1.value._reader.capTable;
        local_4a8 = decl.brand.ptr.field_1.value._reader.segment;
        pCStack_4a0 = decl.brand.ptr.field_1.value._reader.capTable;
        local_498 = decl.brand.ptr.field_1.value._reader.data;
        pWStack_490 = decl.brand.ptr.field_1.value._reader.pointers;
        local_488 = decl.brand.ptr.field_1._32_8_;
        uStack_480 = decl.brand.ptr.field_1._40_8_;
      }
      local_4b0 = decl.brand.ptr.isSet;
      capnp::schema::Type::Interface::Reader::getBrand((Reader *)&local_1b8,(Reader *)&structType);
      capnp::schema::Brand::Reader::getScopes(&local_218,(Reader *)&local_1b8);
      brand_01.reader.capTable = local_218.reader.capTable;
      brand_01.reader.segment = local_218.reader.segment;
      brand_01.reader.ptr = local_218.reader.ptr;
      brand_01.reader.elementCount = local_218.reader.elementCount;
      brand_01.reader.step = local_218.reader.step;
      brand_01.reader.structDataSize = local_218.reader.structDataSize;
      brand_01.reader.structPointerCount = local_218.reader.structPointerCount;
      brand_01.reader.elementSize = local_218.reader.elementSize;
      brand_01.reader._39_1_ = local_218.reader._39_1_;
      brand_01.reader.nestingLimit = local_218.reader.nestingLimit;
      brand_01.reader._44_4_ = local_218.reader._44_4_;
      evaluateBrand((BrandScope *)&elementType,(Resolver *)this,(ResolvedDecl *)resolver,brand_01,
                    (uint)local_4d8);
      auVar3 = ZEXT1640(ZEXT816(0));
      source_01._reader._40_8_ = 0x7fffffff;
      source_01._reader.segment = (SegmentReader *)auVar3._0_8_;
      source_01._reader.capTable = (CapTableReader *)auVar3._8_8_;
      source_01._reader.data = (void *)auVar3._16_8_;
      source_01._reader.pointers = (WirePointer *)auVar3._24_8_;
      source_01._reader.dataSize = auVar3._32_4_;
      source_01._reader.pointerCount = auVar3._36_2_;
      source_01._reader._38_2_ = auVar3._38_2_;
      BrandedDecl::BrandedDecl
                (__return_storage_ptr__,&local_308,
                 (Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&elementType,source_01);
      kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose
                ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&elementType);
      return __return_storage_ptr__;
    case 0x12:
      if ((type._reader.dataSize < 0x50) || (sVar1 = puVar2[4], sVar1 == 0)) {
        which = BUILTIN_ANY_POINTER;
        break;
      }
      if (sVar1 != 1) {
        if (sVar1 == 2) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                    ((Fault *)&decl,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.c++"
                     ,0x208,FAILED,(char *)0x0,
                     "\"Alias pointed to implicit method type parameter?\"",
                     (char (*) [49])"Alias pointed to implicit method type parameter?");
          kj::_::Debug::Fault::fatal((Fault *)&decl);
        }
        goto switchD_00121dbe_default;
      }
      if (type._reader.dataSize < 0xc0) {
        scopeId = 0;
        index = 0;
        if (type._reader.dataSize < 0x60) goto LAB_0012265a;
      }
      else {
        scopeId = *(uint64_t *)(puVar2 + 8);
      }
      index = (uint)(ushort)puVar2[5];
LAB_0012265a:
      lookupParameter((Maybe<capnp::compiler::BrandedDecl> *)&structType,this,resolver,scopeId,index
                     );
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                ((NullableValue<capnp::compiler::BrandedDecl> *)&decl,
                 (NullableValue<capnp::compiler::BrandedDecl> *)&structType);
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
                ((NullableValue<capnp::compiler::BrandedDecl> *)&structType);
      if ((char)decl.id == '\x01') {
        BrandedDecl::BrandedDecl(__return_storage_ptr__,(BrandedDecl *)&decl.genericParamCount);
      }
      else {
        (__return_storage_ptr__->source)._reader.data = (void *)0x0;
        (__return_storage_ptr__->source)._reader.pointers = (WirePointer *)0x0;
        (__return_storage_ptr__->source)._reader.segment = (SegmentReader *)0x0;
        (__return_storage_ptr__->source)._reader.capTable = (CapTableReader *)0x0;
        (__return_storage_ptr__->brand).disposer = (Disposer *)0x0;
        (__return_storage_ptr__->brand).ptr = (BrandScope *)0x0;
        (__return_storage_ptr__->source)._reader.dataSize = 0;
        (__return_storage_ptr__->source)._reader.pointerCount = 0;
        *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = 0;
        *(undefined8 *)&(__return_storage_ptr__->source)._reader.nestingLimit = 0x7fffffff;
        *(uint64_t *)&(__return_storage_ptr__->body).field_1 = scopeId;
        *(uint *)((long)&(__return_storage_ptr__->body).field_1 + 8) = index;
        (__return_storage_ptr__->body).tag = 2;
      }
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
                ((NullableValue<capnp::compiler::BrandedDecl> *)&decl);
      return __return_storage_ptr__;
    default:
switchD_00121dbe_default:
      kj::_::unreachable();
    }
  }
  decompileType::anon_class_16_2_36210f71::operator()(__return_storage_ptr__,&builtin,which);
  return __return_storage_ptr__;
}

Assistant:

BrandedDecl BrandScope::decompileType(
    Resolver& resolver, schema::Type::Reader type) {
  auto builtin = [&](Declaration::Which which) -> BrandedDecl {
    auto decl = resolver.resolveBuiltin(which);
    return BrandedDecl(decl,
        evaluateBrand(resolver, decl, List<schema::Brand::Scope>::Reader()),
        Expression::Reader());
  };

  switch (type.which()) {
    case schema::Type::VOID:    return builtin(Declaration::BUILTIN_VOID);
    case schema::Type::BOOL:    return builtin(Declaration::BUILTIN_BOOL);
    case schema::Type::INT8:    return builtin(Declaration::BUILTIN_INT8);
    case schema::Type::INT16:   return builtin(Declaration::BUILTIN_INT16);
    case schema::Type::INT32:   return builtin(Declaration::BUILTIN_INT32);
    case schema::Type::INT64:   return builtin(Declaration::BUILTIN_INT64);
    case schema::Type::UINT8:   return builtin(Declaration::BUILTIN_U_INT8);
    case schema::Type::UINT16:  return builtin(Declaration::BUILTIN_U_INT16);
    case schema::Type::UINT32:  return builtin(Declaration::BUILTIN_U_INT32);
    case schema::Type::UINT64:  return builtin(Declaration::BUILTIN_U_INT64);
    case schema::Type::FLOAT32: return builtin(Declaration::BUILTIN_FLOAT32);
    case schema::Type::FLOAT64: return builtin(Declaration::BUILTIN_FLOAT64);
    case schema::Type::TEXT:    return builtin(Declaration::BUILTIN_TEXT);
    case schema::Type::DATA:    return builtin(Declaration::BUILTIN_DATA);

    case schema::Type::ENUM: {
      auto enumType = type.getEnum();
      Resolver::ResolvedDecl decl = resolver.resolveId(enumType.getTypeId());
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, enumType.getBrand().getScopes()),
          Expression::Reader());
    }

    case schema::Type::INTERFACE: {
      auto interfaceType = type.getInterface();
      Resolver::ResolvedDecl decl = resolver.resolveId(interfaceType.getTypeId());
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, interfaceType.getBrand().getScopes()),
          Expression::Reader());
    }

    case schema::Type::STRUCT: {
      auto structType = type.getStruct();
      Resolver::ResolvedDecl decl = resolver.resolveId(structType.getTypeId());
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, structType.getBrand().getScopes()),
          Expression::Reader());
    }

    case schema::Type::LIST: {
      auto elementType = decompileType(resolver, type.getList().getElementType());
      return KJ_ASSERT_NONNULL(builtin(Declaration::BUILTIN_LIST)
          .applyParams(kj::heapArray(&elementType, 1), Expression::Reader()));
    }

    case schema::Type::ANY_POINTER: {
      auto anyPointer = type.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return builtin(Declaration::BUILTIN_ANY_POINTER);

        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          auto id = param.getScopeId();
          uint index = param.getParameterIndex();
          KJ_IF_SOME(binding, lookupParameter(resolver, id, index)) {
            return binding;
          } else {
            return BrandedDecl(Resolver::ResolvedParameter {id, index}, Expression::Reader());
          }
        }

        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          KJ_FAIL_ASSERT("Alias pointed to implicit method type parameter?");
      }

      KJ_UNREACHABLE;
    }
  }